

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O0

err_t dstuPointRecover(octet *point,dstu_params *params,octet *xpoint)

{
  bool_t bVar1;
  int iVar2;
  uint uVar3;
  bool_t bVar4;
  word *a;
  void *in_RDX;
  long in_RSI;
  void *in_RDI;
  size_t m;
  void *stack;
  word *y;
  word *x;
  ec_o *ec;
  bool_t trace;
  err_t code;
  size_t local_50;
  size_t *stack_00;
  qr_o *f;
  word *a_00;
  err_t local_4;
  
  a_00 = (word *)0x0;
  local_4 = dstuEcCreate((ec_o **)point,params,(dstu_deep_i)xpoint);
  if (local_4 == 0) {
    bVar1 = memIsValid(in_RDX,*(size_t *)(a_00[3] + 0x38));
    if ((bVar1 == 0) || (bVar1 = memIsValid(in_RDI,*(long *)(a_00[3] + 0x38) << 1), bVar1 == 0)) {
      dstuEcClose((ec_o *)0x175acf);
      local_4 = 0x6d;
    }
    else {
      a = (word *)((long)a_00 + *a_00);
      f = (qr_o *)(a + *(long *)(a_00[3] + 0x30));
      stack_00 = &(f->hdr).keep + *(long *)(a_00[3] + 0x30);
      iVar2 = (**(code **)(a_00[3] + 0x40))(a,in_RDX,a_00[3],stack_00);
      if (iVar2 == 0) {
        dstuEcClose((ec_o *)0x175b60);
        local_4 = 0x191;
      }
      else {
        bVar1 = wwIsZero(a,*(size_t *)(a_00[3] + 0x30));
        if (bVar1 == 0) {
          bVar1 = wwTestBit(a,0);
          wwSetBit(a,0,0);
          uVar3 = gf2Tr(a,f,stack_00);
          if (uVar3 != *(byte *)(in_RSI + 8)) {
            wwSetBit(a,0,1);
          }
          (**(code **)(a_00[3] + 0x70))(f,a,a_00[3],stack_00);
          (**(code **)(a_00[3] + 0x80))(f,a_00[5],f,a_00[3],stack_00);
          wwXor2((word *)f,a,*(size_t *)(a_00[3] + 0x30));
          if (*(char *)(in_RSI + 8) != '\0') {
            wwFlipBit((word *)f,0);
          }
          bVar4 = gf2QSolve((word *)CONCAT44(local_4,bVar1),a_00,a,f,stack_00);
          if (bVar4 == 0) {
            dstuEcClose((ec_o *)0x175d5e);
            local_4 = 0x1f6;
          }
          else {
            bVar4 = gf2Tr(a,f,stack_00);
            if (bVar4 == bVar1) {
              (**(code **)(a_00[3] + 0x68))(f,a,f,a_00[3],stack_00);
            }
            else {
              (**(code **)(a_00[3] + 0x68))(f,a,f,a_00[3],stack_00);
              wwXor2((word *)f,a,*(size_t *)(a_00[3] + 0x30));
            }
            (**(code **)(a_00[3] + 0x48))(in_RDI,a,a_00[3],stack_00);
            (**(code **)(a_00[3] + 0x48))
                      ((long)in_RDI + *(long *)(a_00[3] + 0x38),f,a_00[3],stack_00);
            dstuEcClose((ec_o *)0x175e6c);
          }
        }
        else {
          local_50 = gf2Deg((qr_o *)a_00[3]);
          while (local_50 = local_50 - 1, local_50 != 0) {
            (**(code **)(a_00[3] + 0x70))(a_00[5],a_00[5],a_00[3],stack_00);
          }
          (**(code **)(a_00[3] + 0x48))
                    ((long)in_RDI + *(long *)(a_00[3] + 0x30),a_00[5],a_00[3],stack_00);
          dstuEcClose((ec_o *)0x175c27);
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t dstuPointRecover(octet point[], const dstu_params* params, 
	const octet xpoint[])
{
	err_t code;
	register bool_t trace;
	// состояние
	ec_o* ec = 0;
	word* x;
	word* y;
	void* stack;
	// старт
	code = dstuEcCreate(&ec, params, dstuPointRecover_deep);
	ERR_CALL_CHECK(code);
	// проверить входные указатели
	if (!memIsValid(xpoint, ec->f->no) || 
		!memIsValid(point, 2 * ec->f->no))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	x = objEnd(ec, word);
	y = x + ec->f->n;
	stack = y + ec->f->n;
	// загрузить сжатое представление точки
	if (!qrFrom(x, xpoint, ec->f, stack))
	{
		dstuEcClose(ec);
		return ERR_BAD_POINT;
	}
	// x == 0?
	if (qrIsZero(x, ec->f))
	{
		size_t m = gf2Deg(ec->f);
		// b <- b^{2^{m - 1}}
		while (--m)
			qrSqr(ec->B, ec->B, ec->f, stack);
		// выгрузить y-координату
		qrTo(point + ec->f->n, ec->B, ec->f, stack);
		// все нормально
		dstuEcClose(ec);
		return ERR_OK;
	}
	// восстановить первый разряд x
	trace = wwTestBit(x, 0);
	wwSetBit(x, 0, 0);
	if (gf2Tr(x, ec->f, stack) != (bool_t)params->A)
		wwSetBit(x, 0, 1);
	// y <- x + a + b / x^2
	qrSqr(y, x, ec->f, stack);
	qrDiv(y, ec->B, y, ec->f, stack);
	gf2Add2(y, x, ec->f);
	if (params->A)
		wwFlipBit(y, 0);
	// Solve[z^2 + z == y]
	if (!gf2QSolve(y, ec->f->unity, y, ec->f, stack))
	{
		trace = 0;
		dstuEcClose(ec);
		return ERR_BAD_PARAMS;
	}
	// tr(y) == trace?
	if (gf2Tr(y, ec->f, stack) == trace)
		// y <- y * x
		qrMul(y, x, y, ec->f, stack);
	else
		// y <- (y + 1) * x
		qrMul(y, x, y, ec->f, stack),
		gf2Add2(y, x, ec->f);
	// выгрузить точку
	qrTo(point, x, ec->f, stack);
	qrTo(point + ec->f->no, y, ec->f, stack);
	// все нормально
	trace = 0;
	dstuEcClose(ec);
	return code;
}